

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texture.cpp
# Opt level: O2

void * rw::textureOpen(void *object,int32 offset,int32 size)

{
  long lVar1;
  long lVar2;
  TexDictionary *pTVar3;
  
  lVar1 = engine + 0x20 + (long)offset;
  textureModuleOffset = offset;
  *(long *)lVar1 = lVar1;
  *(long *)(lVar1 + 8) = lVar1;
  lVar1 = engine + offset;
  lVar2 = lVar1 + 0x30;
  *(long *)lVar2 = lVar2;
  *(long *)(lVar1 + 0x38) = lVar2;
  pTVar3 = TexDictionary::create();
  lVar2 = (long)textureModuleOffset;
  *(TexDictionary **)(engine + lVar2) = pTVar3;
  *(TexDictionary **)(engine + 8 + lVar2) = pTVar3;
  lVar1 = engine;
  *(undefined4 *)(engine + 0x10 + lVar2) = 1;
  *(undefined4 *)(lVar1 + 0x14 + (long)textureModuleOffset) = 0;
  *(undefined4 *)(lVar1 + 0x18 + (long)textureModuleOffset) = 0;
  *(undefined4 *)(lVar1 + 0x1c + (long)textureModuleOffset) = 0;
  return object;
}

Assistant:

static void*
textureOpen(void *object, int32 offset, int32 size)
{
	TexDictionary *texdict;
	textureModuleOffset = offset;
	TEXTUREGLOBAL(texDicts).init();
	TEXTUREGLOBAL(textures).init();
	texdict = TexDictionary::create();
	TEXTUREGLOBAL(initialTexDict) = texdict;
	TexDictionary::setCurrent(texdict);
	TEXTUREGLOBAL(loadTextures) = 1;
	TEXTUREGLOBAL(makeDummies) = 0;
	TEXTUREGLOBAL(mipmapping) = 0;
	TEXTUREGLOBAL(autoMipmapping) = 0;
	return object;
}